

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

double __thiscall spvtools::opt::analysis::FloatConstant::GetDoubleValue(FloatConstant *this)

{
  int iVar1;
  uint32_t uVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_reference pvVar4;
  undefined4 extraout_var_01;
  double dVar5;
  FloatProxy<double> local_20;
  FloatProxy<double> a;
  uint64_t combined_words;
  FloatConstant *this_local;
  
  pTVar3 = Constant::type((Constant *)this);
  iVar1 = (*pTVar3->_vptr_Type[0xc])();
  uVar2 = Float::width((Float *)CONCAT44(extraout_var,iVar1));
  if (uVar2 != 0x40) {
    __assert_fail("type()->AsFloat()->width() == 64 && \"Not a 32-bit floating point value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.h"
                  ,0x100,"double spvtools::opt::analysis::FloatConstant::GetDoubleValue() const");
  }
  iVar1 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])();
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(extraout_var_00,iVar1),1);
  a.data_ = (ulong)*pvVar4 << 0x20;
  iVar1 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])();
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(extraout_var_01,iVar1),0);
  a.data_ = *pvVar4 | a.data_;
  utils::FloatProxy<double>::FloatProxy(&local_20,a.data_);
  dVar5 = utils::FloatProxy<double>::getAsFloat(&local_20);
  return dVar5;
}

Assistant:

double GetDoubleValue() const {
    assert(type()->AsFloat()->width() == 64 &&
           "Not a 32-bit floating point value.");
    uint64_t combined_words = words()[1];
    combined_words = combined_words << 32;
    combined_words |= words()[0];
    utils::FloatProxy<double> a(combined_words);
    return a.getAsFloat();
  }